

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O0

HTS_Boolean
HTS_SStreamSet_create
          (HTS_SStreamSet *sss,HTS_ModelSet *ms,HTS_Label *label,HTS_Boolean phoneme_alignment_flag,
          double speed,double *duration_iw,double **parameter_iw,double **gv_iw)

{
  HTS_Boolean HVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  size_t *psVar5;
  double *mean;
  double *vari;
  long lVar6;
  char in_CL;
  HTS_Label *in_RDX;
  HTS_ModelSet *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  double dVar7;
  long in_stack_00000008;
  size_t next_state;
  size_t next_time;
  double frame_length;
  double *duration_vari;
  double *duration_mean;
  HTS_SStream *sst;
  size_t state;
  int shift;
  double temp;
  size_t k;
  size_t j;
  size_t i;
  HTS_ModelSet *in_stack_fffffffffffffe88;
  double *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  double **in_stack_fffffffffffffea0;
  double **in_stack_fffffffffffffea8;
  ulong uVar8;
  HTS_ModelSet *in_stack_fffffffffffffeb0;
  HTS_ModelSet *string;
  double in_stack_fffffffffffffeb8;
  HTS_ModelSet *in_stack_fffffffffffffec0;
  double *in_stack_fffffffffffffec8;
  double *in_stack_fffffffffffffed0;
  HTS_ModelSet *in_stack_fffffffffffffed8;
  long local_a0;
  long local_70;
  int local_64;
  double local_60;
  ulong local_58;
  double *local_50;
  ulong local_48;
  HTS_Boolean local_1;
  
  sVar3 = HTS_Label_get_size(in_RDX);
  if (sVar3 == 0) {
    local_1 = '\0';
  }
  else {
    local_60 = 0.0;
    for (local_48 = 0; sVar3 = HTS_ModelSet_get_nvoices(in_RSI), local_48 < sVar3;
        local_48 = local_48 + 1) {
      local_60 = *(double *)(in_R8 + local_48 * 8) + local_60;
    }
    if ((local_60 != 0.0) || (NAN(local_60))) {
      if ((local_60 != 1.0) || (NAN(local_60))) {
        local_48 = 0;
        while (uVar8 = local_48, sVar3 = HTS_ModelSet_get_nvoices(in_RSI), uVar8 < sVar3) {
          dVar7 = *(double *)(in_R8 + local_48 * 8);
          if ((dVar7 != 0.0) || (NAN(dVar7))) {
            *(double *)(in_R8 + local_48 * 8) = *(double *)(in_R8 + local_48 * 8) / local_60;
          }
          local_48 = local_48 + 1;
        }
      }
      local_48 = 0;
      while (uVar8 = local_48, sVar3 = HTS_ModelSet_get_nstream(in_RSI), uVar8 < sVar3) {
        local_60 = 0.0;
        for (local_50 = (double *)0x0; sVar3 = HTS_ModelSet_get_nvoices(in_RSI), local_50 < sVar3;
            local_50 = (double *)((long)local_50 + 1)) {
          local_60 = *(double *)(*(long *)(in_R9 + (long)local_50 * 8) + local_48 * 8) + local_60;
        }
        if ((local_60 == 0.0) && (!NAN(local_60))) {
          return '\0';
        }
        if ((local_60 != 1.0) || (NAN(local_60))) {
          for (local_50 = (double *)0x0; sVar3 = HTS_ModelSet_get_nvoices(in_RSI), local_50 < sVar3;
              local_50 = (double *)((long)local_50 + 1)) {
            dVar7 = *(double *)(*(long *)(in_R9 + (long)local_50 * 8) + local_48 * 8);
            if ((dVar7 != 0.0) || (NAN(dVar7))) {
              lVar6 = *(long *)(in_R9 + (long)local_50 * 8);
              *(double *)(lVar6 + local_48 * 8) = *(double *)(lVar6 + local_48 * 8) / local_60;
            }
          }
        }
        HVar1 = HTS_ModelSet_use_gv(in_RSI,local_48);
        if (HVar1 != '\0') {
          local_60 = 0.0;
          for (local_50 = (double *)0x0; sVar3 = HTS_ModelSet_get_nvoices(in_RSI), local_50 < sVar3;
              local_50 = (double *)((long)local_50 + 1)) {
            local_60 = *(double *)(*(long *)(in_stack_00000008 + (long)local_50 * 8) + local_48 * 8)
                       + local_60;
          }
          if ((local_60 == 0.0) && (!NAN(local_60))) {
            return '\0';
          }
          if ((local_60 != 1.0) || (NAN(local_60))) {
            for (local_50 = (double *)0x0; sVar3 = HTS_ModelSet_get_nvoices(in_RSI),
                local_50 < sVar3; local_50 = (double *)((long)local_50 + 1)) {
              dVar7 = *(double *)(*(long *)(in_stack_00000008 + (long)local_50 * 8) + local_48 * 8);
              if ((dVar7 != 0.0) || (NAN(dVar7))) {
                lVar6 = *(long *)(in_stack_00000008 + (long)local_50 * 8);
                *(double *)(lVar6 + local_48 * 8) = *(double *)(lVar6 + local_48 * 8) / local_60;
              }
            }
          }
        }
        local_48 = local_48 + 1;
      }
      sVar3 = HTS_ModelSet_get_nstate(in_RSI);
      in_RDI[2] = sVar3;
      sVar3 = HTS_ModelSet_get_nstream(in_RSI);
      in_RDI[1] = sVar3;
      in_RDI[5] = 0;
      sVar3 = HTS_Label_get_size(in_RDX);
      in_RDI[4] = sVar3 * in_RDI[2];
      pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
      in_RDI[3] = (long)pvVar4;
      pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
      *in_RDI = (long)pvVar4;
      for (local_48 = 0; local_48 < (ulong)in_RDI[1]; local_48 = local_48 + 1) {
        psVar5 = (size_t *)(*in_RDI + local_48 * 0x60);
        sVar3 = HTS_ModelSet_get_vector_length(in_RSI,local_48);
        *psVar5 = sVar3;
        pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
        psVar5[1] = (size_t)pvVar4;
        pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
        psVar5[2] = (size_t)pvVar4;
        HVar1 = HTS_ModelSet_is_msd(in_RSI,local_48);
        if (HVar1 == '\0') {
          psVar5[3] = 0;
        }
        else {
          pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
          psVar5[3] = (size_t)pvVar4;
        }
        for (local_50 = (double *)0x0; local_50 < (ulong)in_RDI[4];
            local_50 = (double *)((long)local_50 + 1)) {
          HTS_ModelSet_get_window_size(in_RSI,local_48);
          pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
          *(void **)(psVar5[1] + (long)local_50 * 8) = pvVar4;
          HTS_ModelSet_get_window_size(in_RSI,local_48);
          pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
          *(void **)(psVar5[2] + (long)local_50 * 8) = pvVar4;
        }
        HVar1 = HTS_ModelSet_use_gv(in_RSI,local_48);
        if (HVar1 == '\0') {
          psVar5[0xb] = 0;
        }
        else {
          pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
          psVar5[0xb] = (size_t)pvVar4;
          for (local_50 = (double *)0x0; local_50 < (ulong)in_RDI[4];
              local_50 = (double *)((long)local_50 + 1)) {
            *(undefined1 *)(psVar5[0xb] + (long)local_50) = 1;
          }
        }
      }
      mean = (double *)
             HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
      vari = (double *)
             HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
      for (local_48 = 0; sVar3 = HTS_Label_get_size(in_RDX), local_48 < sVar3;
          local_48 = local_48 + 1) {
        HTS_Label_get_string(in_RDX,local_48);
        HTS_ModelSet_get_duration
                  (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,
                   (double *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   in_stack_fffffffffffffe90);
      }
      if (in_CL == '\x01') {
        local_a0 = 0;
        local_70 = 0;
        for (local_48 = 0; sVar3 = HTS_Label_get_size(in_RDX), local_48 < sVar3;
            local_48 = local_48 + 1) {
          dVar7 = HTS_Label_get_end_frame(in_RDX,local_48);
          if (dVar7 < 0.0) {
            sVar3 = HTS_Label_get_size(in_RDX);
            if (local_48 + 1 == sVar3) {
              HTS_error(-1,"HTS_SStreamSet_create: The time of final label is not specified.\n");
              HTS_set_default_duration
                        ((size_t *)(in_RDI[3] + local_a0 * 8),mean + local_a0,vari + local_a0,
                         (local_70 + in_RDI[2]) - local_a0);
            }
          }
          else {
            HTS_set_specified_duration
                      ((size_t *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                       in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0,
                       in_stack_fffffffffffffeb8);
            local_a0 = local_70 + in_RDI[2];
          }
          local_70 = in_RDI[2] + local_70;
        }
      }
      else if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
        for (local_48 = 0; local_48 < (ulong)in_RDI[4]; local_48 = local_48 + 1) {
        }
        HTS_set_specified_duration
                  ((size_t *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8);
      }
      else {
        HTS_set_default_duration((size_t *)in_RDI[3],mean,vari,in_RDI[4]);
      }
      HTS_free((void *)0x210b1f);
      HTS_free((void *)0x210b2c);
      local_70 = 0;
      for (local_48 = 0; sVar3 = HTS_Label_get_size(in_RDX), local_48 < sVar3;
          local_48 = local_48 + 1) {
        for (local_50 = (double *)0x2; local_50 <= (double *)(in_RDI[2] + 1U);
            local_50 = (double *)((long)local_50 + 1)) {
          in_RDI[5] = *(long *)(in_RDI[3] + local_70 * 8) + in_RDI[5];
          for (local_58 = 0; local_58 < (ulong)in_RDI[1]; local_58 = local_58 + 1) {
            lVar6 = *in_RDI + local_58 * 0x60;
            if (*(long *)(lVar6 + 0x18) == 0) {
              in_stack_fffffffffffffec0 = in_RSI;
              in_stack_fffffffffffffed0 = local_50;
              HTS_Label_get_string(in_RDX,local_48);
              in_stack_fffffffffffffe88 = *(HTS_ModelSet **)(*(long *)(lVar6 + 0x10) + local_70 * 8)
              ;
              in_stack_fffffffffffffe90 = (double *)0x0;
              HTS_ModelSet_get_parameter
                        (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                         (size_t)in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                         in_stack_fffffffffffffed0,(double *)in_stack_fffffffffffffed8);
            }
            else {
              in_stack_fffffffffffffed8 = in_RSI;
              HTS_Label_get_string(in_RDX,local_48);
              in_stack_fffffffffffffe88 = *(HTS_ModelSet **)(*(long *)(lVar6 + 0x10) + local_70 * 8)
              ;
              in_stack_fffffffffffffe90 = (double *)(*(long *)(lVar6 + 0x18) + local_70 * 8);
              HTS_ModelSet_get_parameter
                        (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                         (size_t)in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                         in_stack_fffffffffffffed0,(double *)in_stack_fffffffffffffed8);
            }
          }
          local_70 = local_70 + 1;
        }
      }
      for (local_48 = 0; local_48 < (ulong)in_RDI[1]; local_48 = local_48 + 1) {
        lVar6 = *in_RDI + local_48 * 0x60;
        sVar3 = HTS_ModelSet_get_window_size(in_RSI,local_48);
        *(size_t *)(lVar6 + 0x20) = sVar3;
        sVar3 = HTS_ModelSet_get_window_max_width(in_RSI,local_48);
        *(size_t *)(lVar6 + 0x40) = sVar3;
        pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
        *(void **)(lVar6 + 0x28) = pvVar4;
        pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
        *(void **)(lVar6 + 0x30) = pvVar4;
        pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
        *(void **)(lVar6 + 0x38) = pvVar4;
        for (local_50 = (double *)0x0; local_50 < *(ulong *)(lVar6 + 0x20);
            local_50 = (double *)((long)local_50 + 1)) {
          iVar2 = HTS_ModelSet_get_window_left_width(in_RSI,local_48,(size_t)local_50);
          *(int *)(*(long *)(lVar6 + 0x28) + (long)local_50 * 4) = iVar2;
          iVar2 = HTS_ModelSet_get_window_right_width(in_RSI,local_48,(size_t)local_50);
          *(int *)(*(long *)(lVar6 + 0x30) + (long)local_50 * 4) = iVar2;
          if (*(int *)(*(long *)(lVar6 + 0x28) + (long)local_50 * 4) +
              *(int *)(*(long *)(lVar6 + 0x30) + (long)local_50 * 4) == 0) {
            pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90)
            ;
            *(void **)(*(long *)(lVar6 + 0x38) + (long)local_50 * 8) = pvVar4;
          }
          else {
            pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90)
            ;
            *(void **)(*(long *)(lVar6 + 0x38) + (long)local_50 * 8) = pvVar4;
          }
          *(long *)(*(long *)(lVar6 + 0x38) + (long)local_50 * 8) =
               *(long *)(*(long *)(lVar6 + 0x38) + (long)local_50 * 8) +
               (long)*(int *)(*(long *)(lVar6 + 0x28) + (long)local_50 * 4) * -8;
          for (local_64 = *(int *)(*(long *)(lVar6 + 0x28) + (long)local_50 * 4);
              local_64 <= *(int *)(*(long *)(lVar6 + 0x30) + (long)local_50 * 4);
              local_64 = local_64 + 1) {
            dVar7 = HTS_ModelSet_get_window_coefficient
                              (in_RSI,local_48,(size_t)local_50,(long)local_64);
            *(double *)
             (*(long *)(*(long *)(lVar6 + 0x38) + (long)local_50 * 8) + (long)local_64 * 8) = dVar7;
          }
        }
      }
      for (local_48 = 0; local_48 < (ulong)in_RDI[1]; local_48 = local_48 + 1) {
        lVar6 = *in_RDI + local_48 * 0x60;
        HVar1 = HTS_ModelSet_use_gv(in_RSI,local_48);
        if (HVar1 == '\0') {
          *(undefined8 *)(lVar6 + 0x48) = 0;
          *(undefined8 *)(lVar6 + 0x50) = 0;
        }
        else {
          pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
          *(void **)(lVar6 + 0x48) = pvVar4;
          pvVar4 = HTS_calloc((size_t)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
          *(void **)(lVar6 + 0x50) = pvVar4;
          string = in_RSI;
          uVar8 = local_48;
          HTS_Label_get_string(in_RDX,0);
          HTS_ModelSet_get_gv(in_stack_fffffffffffffec0,uVar8,(char *)string,
                              in_stack_fffffffffffffea8,(double *)in_stack_fffffffffffffea0,
                              in_stack_fffffffffffffe98);
        }
      }
      local_48 = 0;
      while (uVar8 = local_48, sVar3 = HTS_Label_get_size(in_RDX), uVar8 < sVar3) {
        HTS_Label_get_string(in_RDX,local_48);
        HVar1 = HTS_ModelSet_get_gv_flag(in_stack_fffffffffffffe88,(char *)0x2112d7);
        if (HVar1 == '\0') {
          for (local_50 = (double *)0x0; local_50 < (ulong)in_RDI[1];
              local_50 = (double *)((long)local_50 + 1)) {
            HVar1 = HTS_ModelSet_use_gv(in_RSI,(size_t)local_50);
            if (HVar1 == '\x01') {
              for (local_58 = 0; local_58 < (ulong)in_RDI[2]; local_58 = local_58 + 1) {
                *(undefined1 *)
                 (*(long *)(*in_RDI + (long)local_50 * 0x60 + 0x58) +
                 local_48 * in_RDI[2] + local_58) = 0;
              }
            }
          }
        }
        local_48 = local_48 + 1;
      }
      local_1 = '\x01';
    }
    else {
      local_1 = '\0';
    }
  }
  return local_1;
}

Assistant:

HTS_Boolean HTS_SStreamSet_create(HTS_SStreamSet * sss, HTS_ModelSet * ms, HTS_Label * label, HTS_Boolean phoneme_alignment_flag, double speed, double *duration_iw, double **parameter_iw, double **gv_iw)
{
   size_t i, j, k;
   double temp;
   int shift;
   size_t state;
   HTS_SStream *sst;
   double *duration_mean, *duration_vari;
   double frame_length;
   size_t next_time;
   size_t next_state;

   if (HTS_Label_get_size(label) == 0)
      return FALSE;

   /* check interpolation weights */
   for (i = 0, temp = 0.0; i < HTS_ModelSet_get_nvoices(ms); i++)
      temp += duration_iw[i];
   if (temp == 0.0) {
      return FALSE;
   } else if (temp != 1.0) {
      for (i = 0; i < HTS_ModelSet_get_nvoices(ms); i++)
         if (duration_iw[i] != 0.0)
            duration_iw[i] /= temp;
   }

   for (i = 0; i < HTS_ModelSet_get_nstream(ms); i++) {
      for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
         temp += parameter_iw[j][i];
      if (temp == 0.0) {
         return FALSE;
      } else if (temp != 1.0) {
         for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
            if (parameter_iw[j][i] != 0.0)
               parameter_iw[j][i] /= temp;
      }
      if (HTS_ModelSet_use_gv(ms, i)) {
         for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
            temp += gv_iw[j][i];
         if (temp == 0.0)
            return FALSE;
         else if (temp != 1.0)
            for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
               if (gv_iw[j][i] != 0.0)
                  gv_iw[j][i] /= temp;
      }
   }

   /* initialize state sequence */
   sss->nstate = HTS_ModelSet_get_nstate(ms);
   sss->nstream = HTS_ModelSet_get_nstream(ms);
   sss->total_frame = 0;
   sss->total_state = HTS_Label_get_size(label) * sss->nstate;
   sss->duration = (size_t *) HTS_calloc(sss->total_state, sizeof(size_t));
   sss->sstream = (HTS_SStream *) HTS_calloc(sss->nstream, sizeof(HTS_SStream));
   for (i = 0; i < sss->nstream; i++) {
      sst = &sss->sstream[i];
      sst->vector_length = HTS_ModelSet_get_vector_length(ms, i);
      sst->mean = (double **) HTS_calloc(sss->total_state, sizeof(double *));
      sst->vari = (double **) HTS_calloc(sss->total_state, sizeof(double *));
      if (HTS_ModelSet_is_msd(ms, i))
         sst->msd = (double *) HTS_calloc(sss->total_state, sizeof(double));
      else
         sst->msd = NULL;
      for (j = 0; j < sss->total_state; j++) {
         sst->mean[j] = (double *) HTS_calloc(sst->vector_length * HTS_ModelSet_get_window_size(ms, i), sizeof(double));
         sst->vari[j] = (double *) HTS_calloc(sst->vector_length * HTS_ModelSet_get_window_size(ms, i), sizeof(double));
      }
      if (HTS_ModelSet_use_gv(ms, i)) {
         sst->gv_switch = (HTS_Boolean *) HTS_calloc(sss->total_state, sizeof(HTS_Boolean));
         for (j = 0; j < sss->total_state; j++)
            sst->gv_switch[j] = TRUE;
      } else {
         sst->gv_switch = NULL;
      }
   }

   /* determine state duration */
   duration_mean = (double *) HTS_calloc(sss->total_state, sizeof(double));
   duration_vari = (double *) HTS_calloc(sss->total_state, sizeof(double));
   for (i = 0; i < HTS_Label_get_size(label); i++)
      HTS_ModelSet_get_duration(ms, HTS_Label_get_string(label, i), duration_iw, &duration_mean[i * sss->nstate], &duration_vari[i * sss->nstate]);
   if (phoneme_alignment_flag == TRUE) {
      /* use duration set by user */
      next_time = 0;
      next_state = 0;
      state = 0;
      for (i = 0; i < HTS_Label_get_size(label); i++) {
         temp = HTS_Label_get_end_frame(label, i);
         if (temp >= 0) {
            next_time += (size_t) HTS_set_specified_duration(&sss->duration[next_state], &duration_mean[next_state], &duration_vari[next_state], state + sss->nstate - next_state, temp - next_time);
            next_state = state + sss->nstate;
         } else if (i + 1 == HTS_Label_get_size(label)) {
            HTS_error(-1, "HTS_SStreamSet_create: The time of final label is not specified.\n");
            HTS_set_default_duration(&sss->duration[next_state], &duration_mean[next_state], &duration_vari[next_state], state + sss->nstate - next_state);
         }
         state += sss->nstate;
      }
   } else {
      /* determine frame length */
      if (speed != 1.0) {
         temp = 0.0;
         for (i = 0; i < sss->total_state; i++) {
            temp += duration_mean[i];
         }
         frame_length = temp / speed;
         HTS_set_specified_duration(sss->duration, duration_mean, duration_vari, sss->total_state, frame_length);
      } else {
         HTS_set_default_duration(sss->duration, duration_mean, duration_vari, sss->total_state);
      }
   }
   HTS_free(duration_mean);
   HTS_free(duration_vari);

   /* get parameter */
   for (i = 0, state = 0; i < HTS_Label_get_size(label); i++) {
      for (j = 2; j <= sss->nstate + 1; j++) {
         sss->total_frame += sss->duration[state];
         for (k = 0; k < sss->nstream; k++) {
            sst = &sss->sstream[k];
            if (sst->msd)
               HTS_ModelSet_get_parameter(ms, k, j, HTS_Label_get_string(label, i), (const double *const *) parameter_iw, sst->mean[state], sst->vari[state], &sst->msd[state]);
            else
               HTS_ModelSet_get_parameter(ms, k, j, HTS_Label_get_string(label, i), (const double *const *) parameter_iw, sst->mean[state], sst->vari[state], NULL);
         }
         state++;
      }
   }

   /* copy dynamic window */
   for (i = 0; i < sss->nstream; i++) {
      sst = &sss->sstream[i];
      sst->win_size = HTS_ModelSet_get_window_size(ms, i);
      sst->win_max_width = HTS_ModelSet_get_window_max_width(ms, i);
      sst->win_l_width = (int *) HTS_calloc(sst->win_size, sizeof(int));
      sst->win_r_width = (int *) HTS_calloc(sst->win_size, sizeof(int));
      sst->win_coefficient = (double **) HTS_calloc(sst->win_size, sizeof(double));
      for (j = 0; j < sst->win_size; j++) {
         sst->win_l_width[j] = HTS_ModelSet_get_window_left_width(ms, i, j);
         sst->win_r_width[j] = HTS_ModelSet_get_window_right_width(ms, i, j);
         if (sst->win_l_width[j] + sst->win_r_width[j] == 0)
            sst->win_coefficient[j] = (double *) HTS_calloc(-2 * sst->win_l_width[j] + 1, sizeof(double));
         else
            sst->win_coefficient[j] = (double *) HTS_calloc(-2 * sst->win_l_width[j], sizeof(double));
         sst->win_coefficient[j] -= sst->win_l_width[j];
         for (shift = sst->win_l_width[j]; shift <= sst->win_r_width[j]; shift++)
            sst->win_coefficient[j][shift] = HTS_ModelSet_get_window_coefficient(ms, i, j, shift);
      }
   }

   /* determine GV */
   for (i = 0; i < sss->nstream; i++) {
      sst = &sss->sstream[i];
      if (HTS_ModelSet_use_gv(ms, i)) {
         sst->gv_mean = (double *) HTS_calloc(sst->vector_length, sizeof(double));
         sst->gv_vari = (double *) HTS_calloc(sst->vector_length, sizeof(double));
         HTS_ModelSet_get_gv(ms, i, HTS_Label_get_string(label, 0), (const double *const *) gv_iw, sst->gv_mean, sst->gv_vari);
      } else {
         sst->gv_mean = NULL;
         sst->gv_vari = NULL;
      }
   }

   for (i = 0; i < HTS_Label_get_size(label); i++)
      if (HTS_ModelSet_get_gv_flag(ms, HTS_Label_get_string(label, i)) == FALSE)
         for (j = 0; j < sss->nstream; j++)
            if (HTS_ModelSet_use_gv(ms, j) == TRUE)
               for (k = 0; k < sss->nstate; k++)
                  sss->sstream[j].gv_switch[i * sss->nstate + k] = FALSE;

   return TRUE;
}